

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libmeshb7.c
# Opt level: O3

void ExpFmt(GmfMshSct *msh,int KwdCod)

{
  int *piVar1;
  char cVar2;
  int iVar3;
  char *__s;
  bool bVar4;
  uint uVar5;
  long lVar6;
  size_t sVar7;
  ulong uVar8;
  int iVar9;
  long lVar10;
  int iVar11;
  ulong uVar12;
  int iVar13;
  
  __s = GmfKwdFmt[KwdCod][2];
  if (*GmfKwdFmt[KwdCod][1] == '\0') {
    iVar11 = 1;
LAB_00108166:
    msh->KwdTab[KwdCod].typ = iVar11;
  }
  else {
    iVar11 = 2;
    if ((((*__s != 'h') && (*__s != 's')) || (__s[1] != 'r')) || (__s[2] != '\0'))
    goto LAB_00108166;
    msh->KwdTab[KwdCod].typ = 3;
    lVar6 = (long)msh->KwdTab[KwdCod].NmbTyp;
    if (0 < lVar6) {
      lVar10 = 0;
      iVar11 = 0;
      do {
        switch(msh->KwdTab[KwdCod].TypTab[lVar10]) {
        case 1:
          iVar11 = iVar11 + 1;
          break;
        case 2:
          iVar11 = iVar11 + msh->dim;
          break;
        case 3:
          iVar13 = ((msh->dim + 1) * msh->dim) / 2;
          goto LAB_00108150;
        case 4:
          iVar13 = msh->dim * msh->dim;
LAB_00108150:
          iVar11 = iVar11 + iVar13;
        }
        lVar10 = lVar10 + 1;
      } while (lVar6 != lVar10);
      goto LAB_0010816b;
    }
  }
  iVar11 = 0;
LAB_0010816b:
  msh->KwdTab[KwdCod].SolSiz = 0;
  msh->KwdTab[KwdCod].NmbWrd = 0;
  sVar7 = strlen(__s);
  if ((int)sVar7 < 1) {
    uVar8 = 0;
  }
  else {
    iVar13 = 0;
    do {
      cVar2 = __s[iVar13];
      lVar6 = (long)iVar13 + 1;
      if ((cVar2 == 's') || (cVar2 == 'h')) {
        iVar13 = iVar13 + 2;
        if (0 < iVar11) {
          cVar2 = __s[lVar6];
          iVar9 = iVar11;
          do {
            iVar3 = msh->KwdTab[KwdCod].SolSiz;
            msh->KwdTab[KwdCod].SolSiz = iVar3 + 1;
            msh->KwdTab[KwdCod].fmt[iVar3] = cVar2;
            iVar9 = iVar9 + -1;
          } while (iVar9 != 0);
        }
      }
      else if (cVar2 == 'd') {
        iVar13 = iVar13 + 2;
        if (0 < msh->dim) {
          cVar2 = __s[lVar6];
          iVar9 = 0;
          do {
            iVar3 = msh->KwdTab[KwdCod].SolSiz;
            msh->KwdTab[KwdCod].SolSiz = iVar3 + 1;
            msh->KwdTab[KwdCod].fmt[iVar3] = cVar2;
            iVar9 = iVar9 + 1;
          } while (iVar9 < msh->dim);
        }
      }
      else {
        iVar13 = msh->KwdTab[KwdCod].SolSiz;
        msh->KwdTab[KwdCod].SolSiz = iVar13 + 1;
        msh->KwdTab[KwdCod].fmt[iVar13] = cVar2;
        iVar13 = (int)lVar6;
      }
      sVar7 = strlen(__s);
    } while (iVar13 < (int)sVar7);
    uVar8 = (ulong)(uint)msh->KwdTab[KwdCod].SolSiz;
  }
  iVar11 = msh->FltSiz;
  iVar13 = msh->ver;
  uVar5 = (uint)uVar8;
  if (0 < (int)uVar5) {
    uVar12 = 0;
    do {
      cVar2 = msh->KwdTab[KwdCod].fmt[uVar12];
      iVar9 = (iVar11 != 0x20) + 1;
      if ((cVar2 == 'r') || (iVar9 = (3 < iVar13) + 1, cVar2 == 'i')) {
LAB_00108270:
        piVar1 = &msh->KwdTab[KwdCod].NmbWrd;
        *piVar1 = *piVar1 + iVar9;
      }
      else if (cVar2 == 'c') {
        iVar9 = 0x40;
        goto LAB_00108270;
      }
      uVar12 = uVar12 + 1;
    } while (uVar8 != uVar12);
  }
  if ((((*__s == 'h') && (__s[1] == 'r')) && (__s[2] == '\0')) &&
     (iVar11 = msh->KwdTab[KwdCod].NmbNod, 1 < iVar11)) {
    iVar13 = 1;
    do {
      if (0 < (int)uVar8) {
        lVar6 = 0;
        do {
          msh->KwdTab[KwdCod].fmt[lVar6 + (int)uVar8 * iVar13] = msh->KwdTab[KwdCod].fmt[lVar6];
          lVar6 = lVar6 + 1;
          uVar8 = (ulong)msh->KwdTab[KwdCod].SolSiz;
        } while (lVar6 < (long)uVar8);
        iVar11 = msh->KwdTab[KwdCod].NmbNod;
      }
      bVar4 = iVar13 < iVar11;
      iVar13 = iVar13 + 1;
    } while (bVar4);
    uVar5 = (int)uVar8 * iVar11;
    msh->KwdTab[KwdCod].SolSiz = uVar5;
    msh->KwdTab[KwdCod].NmbWrd = iVar11 * msh->KwdTab[KwdCod].NmbWrd;
  }
  if (0 < (int)uVar5) {
    uVar8 = 0;
    do {
      cVar2 = msh->KwdTab[KwdCod].fmt[uVar8];
      if (cVar2 == 'r') {
        piVar1 = &msh->KwdTab[KwdCod].NmbDbl;
        *piVar1 = *piVar1 + 1;
      }
      else if (cVar2 == 'i') {
        piVar1 = &msh->KwdTab[KwdCod].NmbInt;
        *piVar1 = *piVar1 + 1;
      }
      uVar8 = uVar8 + 1;
    } while (uVar5 != uVar8);
  }
  return;
}

Assistant:

static void ExpFmt(GmfMshSct *msh, int KwdCod)
{
   int         i, j, TmpSiz=0, IntWrd, FltWrd;
   char        chr;
   const char  *InpFmt = GmfKwdFmt[ KwdCod ][2];
   KwdSct      *kwd = &msh->KwdTab[ KwdCod ];

   // Set the kwd's type
   if(!strlen(GmfKwdFmt[ KwdCod ][1]))
      kwd->typ = InfKwd;
   else if( !strcmp(InpFmt, "sr") || !strcmp(InpFmt, "hr") )
      kwd->typ = SolKwd;
   else
      kwd->typ = RegKwd;

   // Get the solution-field's size
   if(kwd->typ == SolKwd)
      for(i=0;i<kwd->NmbTyp;i++)
         switch(kwd->TypTab[i])
         {
            case GmfSca    : TmpSiz += 1; break;
            case GmfVec    : TmpSiz += msh->dim; break;
            case GmfSymMat : TmpSiz += (msh->dim * (msh->dim+1)) / 2; break;
            case GmfMat    : TmpSiz += msh->dim * msh->dim; break;
         }

   // Scan each character from the format string
   i = kwd->SolSiz = kwd->NmbWrd = 0;

   while(i < (int)strlen(InpFmt))
   {
      chr = InpFmt[ i++ ];

      if(chr == 'd')
      {
         chr = InpFmt[i++];

         for(j=0;j<msh->dim;j++)
            kwd->fmt[ kwd->SolSiz++ ] = chr;
      }
      else if((chr == 's')||(chr == 'h'))
      {
         chr = InpFmt[i++];

         for(j=0;j<TmpSiz;j++)
            kwd->fmt[ kwd->SolSiz++ ] = chr;
      }
      else
         kwd->fmt[ kwd->SolSiz++ ] = chr;
   }

   if(msh->FltSiz == 32)
      FltWrd = 1;
   else
      FltWrd = 2;

   if(msh->ver <= 3)
      IntWrd = 1;
   else
      IntWrd = 2;

   for(i=0;i<kwd->SolSiz;i++)
      switch(kwd->fmt[i])
      {
         case 'i' : kwd->NmbWrd += IntWrd; break;
         case 'c' : kwd->NmbWrd += FilStrSiz; break;
         case 'r' : kwd->NmbWrd += FltWrd;break;
      }

   // HO solution: duplicate the format as many times as the number of nodes
   if( !strcmp(InpFmt, "hr") && (kwd->NmbNod > 1) )
   {
      for(i=1;i<=kwd->NmbNod;i++)
         for(j=0;j<kwd->SolSiz;j++)
            kwd->fmt[ i * kwd->SolSiz + j ] = kwd->fmt[j];

      kwd->SolSiz *= kwd->NmbNod;
      kwd->NmbWrd *= kwd->NmbNod;
   }

   // Count the final number of intergers and reals needed by the Fortran API
   for(i=0;i<kwd->SolSiz;i++)
      if(kwd->fmt[i] == 'i')
         kwd->NmbInt++;
      else if(kwd->fmt[i] == 'r')
         kwd->NmbDbl++;
}